

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::VisionFeaturePrint
          (VisionFeaturePrint *this,VisionFeaturePrint *from)

{
  VisionFeaturePrintTypeCase VVar1;
  InternalMetadataWithArenaLite *this_00;
  VisionFeaturePrint_Scene *this_01;
  VisionFeaturePrint_Scene *from_00;
  VisionFeaturePrint_Objects *this_02;
  VisionFeaturePrint_Objects *from_01;
  VisionFeaturePrint *from_local;
  VisionFeaturePrint *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__VisionFeaturePrint_00575e40;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  VisionFeaturePrintTypeUnion::VisionFeaturePrintTypeUnion
            ((VisionFeaturePrintTypeUnion *)&this->VisionFeaturePrintType_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  clear_has_VisionFeaturePrintType(this);
  VVar1 = VisionFeaturePrintType_case(from);
  if (VVar1 != VISIONFEATUREPRINTTYPE_NOT_SET) {
    if (VVar1 == kScene) {
      this_01 = mutable_scene(this);
      from_00 = scene(from);
      VisionFeaturePrint_Scene::MergeFrom(this_01,from_00);
    }
    else if (VVar1 == kObjects) {
      this_02 = mutable_objects(this);
      from_01 = objects(from);
      VisionFeaturePrint_Objects::MergeFrom(this_02,from_01);
    }
  }
  return;
}

Assistant:

VisionFeaturePrint::VisionFeaturePrint(const VisionFeaturePrint& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_VisionFeaturePrintType();
  switch (from.VisionFeaturePrintType_case()) {
    case kScene: {
      mutable_scene()->::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::MergeFrom(from.scene());
      break;
    }
    case kObjects: {
      mutable_objects()->::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::MergeFrom(from.objects());
      break;
    }
    case VISIONFEATUREPRINTTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
}